

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

string * __thiscall
phosg::JSON::serialize_abi_cxx11_
          (string *__return_storage_ptr__,JSON *this,uint32_t options,size_t indent_level)

{
  pointer puVar1;
  double dVar2;
  bool bVar3;
  string *s;
  int64_t iVar4;
  size_type sVar5;
  list_type *plVar6;
  dict_type *pdVar7;
  undefined8 uVar8;
  parse_error *this_00;
  char *pcVar9;
  __node_base *p_Var10;
  char *pcVar11;
  anon_class_40_5_0b9c1222 *paVar12;
  StringEscapeMode mode;
  pointer puVar13;
  bool format;
  StringEscapeMode escape_mode;
  uint32_t options_local;
  string ret;
  size_t indent_level_local;
  undefined1 local_c0 [32];
  anon_class_40_5_0b9c1222 add_key;
  string ret_2;
  string local_50;
  
  if ((options & 0x20) == 0) {
    if ((options & 0x10) == 0) {
      escape_mode = STANDARD;
      mode = STANDARD;
    }
    else {
      escape_mode = HEX;
      mode = HEX;
    }
  }
  else {
    escape_mode = CONTROL_ONLY;
    mode = CONTROL_ONLY;
  }
  options_local = options;
  indent_level_local = indent_level;
  switch(*(__index_type *)
          ((long)&(this->value).
                  super__Variant_base<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                  .
                  super__Move_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                  .
                  super__Copy_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                  .
                  super__Move_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                  .
                  super__Copy_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                  .
                  super__Variant_storage_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
          + 0x38)) {
  case '\0':
    pcVar11 = "n";
    if ((options & 2) == 0) {
      pcVar11 = "null";
    }
    goto LAB_0011bed9;
  case '\x01':
    bVar3 = as_bool(this);
    if ((options & 2) == 0) {
      pcVar9 = "true";
      pcVar11 = "false";
    }
    else {
      pcVar9 = "t";
      pcVar11 = "f";
    }
    if (bVar3) {
      pcVar11 = pcVar9;
    }
LAB_0011bed9:
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar11,(allocator<char> *)&ret);
    return __return_storage_ptr__;
  case '\x02':
    iVar4 = as_int(this);
    if ((options & 1) == 0) {
      iVar4 = as_int(this);
      ::std::__cxx11::to_string(__return_storage_ptr__,iVar4);
      return __return_storage_ptr__;
    }
    if (iVar4 < 0) {
      iVar4 = -iVar4;
      pcVar11 = "-0x%lX";
    }
    else {
      pcVar11 = "0x%lX";
    }
    string_printf_abi_cxx11_(__return_storage_ptr__,pcVar11,iVar4);
    return __return_storage_ptr__;
  case '\x03':
    dVar2 = as_float(this);
    string_printf_abi_cxx11_(&ret,"%g",SUB84(dVar2,0));
    sVar5 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&ret,'.',0);
    if (sVar5 == 0xffffffffffffffff) {
      ::std::operator+(__return_storage_ptr__,&ret,".0");
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ret._M_dataplus._M_p == &ret.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = ret.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = ret.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = ret._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = ret.field_2._M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = ret._M_string_length;
      ret._M_string_length = 0;
      ret.field_2._M_allocated_capacity = ret.field_2._M_allocated_capacity & 0xffffffffffffff00;
      ret._M_dataplus._M_p = (pointer)&ret.field_2;
    }
    break;
  case '\x04':
    s = as_string_abi_cxx11_(this);
    escape_string((string *)&add_key,s,mode);
    ::std::operator+(&ret,"\"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&add_key);
    ::std::operator+(__return_storage_ptr__,&ret,"\"");
    ::std::__cxx11::string::~string((string *)&ret);
    paVar12 = &add_key;
    goto LAB_0011c0e6;
  case '\x05':
    plVar6 = as_list(this);
    if ((plVar6->
        super__Vector_base<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (plVar6->
        super__Vector_base<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      pcVar11 = "[]";
      goto LAB_0011bed9;
    }
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ret,"[",(allocator<char> *)&add_key);
    puVar1 = (plVar6->
             super__Vector_base<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (puVar13 = (plVar6->
                   super__Vector_base<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar1;
        puVar13 = puVar13 + 1) {
      if (1 < ret._M_string_length) {
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&ret,',');
      }
      if ((options & 4) == 0) {
        serialize_abi_cxx11_
                  ((string *)&add_key,
                   (puVar13->_M_t).
                   super___uniq_ptr_impl<phosg::JSON,_std::default_delete<phosg::JSON>_>._M_t.
                   super__Tuple_impl<0UL,_phosg::JSON_*,_std::default_delete<phosg::JSON>_>.
                   super__Head_base<0UL,_phosg::JSON_*,_false>._M_head_impl,options_local,0);
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &add_key);
        paVar12 = &add_key;
      }
      else {
        local_c0._0_8_ = local_c0 + 0x10;
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                     indent_level_local + 2,' ');
        ::std::operator+(&ret_2,'\n',
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c0);
        serialize_abi_cxx11_
                  (&local_50,
                   (puVar13->_M_t).
                   super___uniq_ptr_impl<phosg::JSON,_std::default_delete<phosg::JSON>_>._M_t.
                   super__Tuple_impl<0UL,_phosg::JSON_*,_std::default_delete<phosg::JSON>_>.
                   super__Head_base<0UL,_phosg::JSON_*,_false>._M_head_impl,options_local,
                   indent_level_local + 2);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &add_key,&ret_2,&local_50);
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &add_key);
        ::std::__cxx11::string::~string((string *)&add_key);
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::__cxx11::string::~string((string *)&ret_2);
        paVar12 = (anon_class_40_5_0b9c1222 *)local_c0;
      }
      ::std::__cxx11::string::~string((string *)paVar12);
    }
    if ((options & 4) == 0) {
      ::std::operator+(__return_storage_ptr__,&ret,"]");
    }
    else {
      ::std::operator+(&ret_2,&ret,'\n');
      local_c0._0_8_ = local_c0 + 0x10;
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_construct((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   indent_level_local,' ');
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&add_key
                       ,&ret_2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_c0);
      ::std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&add_key
                       ,"]");
      ::std::__cxx11::string::~string((string *)&add_key);
      ::std::__cxx11::string::~string((string *)local_c0);
      ::std::__cxx11::string::~string((string *)&ret_2);
    }
    break;
  case '\x06':
    format = (bool)((byte)options >> 2 & 1);
    pdVar7 = as_dict_abi_cxx11_(this);
    if ((pdVar7->_M_h)._M_element_count == 0) {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"{}",(allocator<char> *)&ret);
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ret_2,"{",(allocator<char> *)&ret);
    add_key.escape_mode = &escape_mode;
    add_key.format = &format;
    add_key.indent_level = &indent_level_local;
    add_key.options = &options_local;
    add_key.ret = &ret_2;
    if ((options & 8) == 0) {
      p_Var10 = &(pdVar7->_M_h)._M_before_begin;
      while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
        serialize::anon_class_40_5_0b9c1222::operator()
                  (&add_key,(string *)(p_Var10 + 1),(JSON *)p_Var10[5]._M_nxt);
      }
    }
    else {
      ret._M_string_length = ret._M_string_length & 0xffffffff00000000;
      ret.field_2._M_allocated_capacity = 0;
      p_Var10 = &(pdVar7->_M_h)._M_before_begin;
      ret.field_2._8_8_ = &ret._M_string_length;
      while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
        local_c0._0_8_ = p_Var10[5]._M_nxt;
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,phosg::JSON*>,std::_Select1st<std::pair<std::__cxx11::string_const,phosg::JSON*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,phosg::JSON*>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,phosg::JSON*>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,phosg::JSON*>,std::_Select1st<std::pair<std::__cxx11::string_const,phosg::JSON*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,phosg::JSON*>>>
                    *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var10 + 1),(JSON **)local_c0);
      }
      for (uVar8 = ret.field_2._8_8_; (size_type *)uVar8 != &ret._M_string_length;
          uVar8 = ::std::_Rb_tree_increment((_Rb_tree_node_base *)uVar8)) {
        serialize::anon_class_40_5_0b9c1222::operator()
                  (&add_key,(string *)(uVar8 + 0x20),*(JSON **)(uVar8 + 0x40));
      }
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>_>_>
                   *)&ret);
    }
    if (format == true) {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                       ,&ret_2,'\n');
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_construct(&local_50,indent_level_local,' ');
      ::std::operator+(&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c0,&local_50);
      ::std::operator+(__return_storage_ptr__,&ret,"}");
      ::std::__cxx11::string::~string((string *)&ret);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)local_c0);
    }
    else {
      ::std::operator+(__return_storage_ptr__,&ret_2,"}");
    }
    paVar12 = (anon_class_40_5_0b9c1222 *)&ret_2;
    goto LAB_0011c0e6;
  default:
    this_00 = (parse_error *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ret,"unknown object type",(allocator<char> *)&add_key);
    parse_error::parse_error(this_00,&ret);
    __cxa_throw(this_00,&parse_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  paVar12 = (anon_class_40_5_0b9c1222 *)&ret;
LAB_0011c0e6:
  ::std::__cxx11::string::~string((string *)paVar12);
  return __return_storage_ptr__;
}

Assistant:

string JSON::serialize(uint32_t options, size_t indent_level) const {
  StringEscapeMode escape_mode;
  if (options & SerializeOption::ESCAPE_CONTROLS_ONLY) {
    escape_mode = StringEscapeMode::CONTROL_ONLY;
  } else if (options & SerializeOption::HEX_ESCAPE_CODES) {
    escape_mode = StringEscapeMode::HEX;
  } else {
    escape_mode = StringEscapeMode::STANDARD;
  }

  size_t type_index = this->value.index();
  switch (type_index) {
    case 0: // nullptr_t
      return (options & SerializeOption::ONE_CHARACTER_TRIVIAL_CONSTANTS) ? "n" : "null";

    case 1: // bool
      if (options & SerializeOption::ONE_CHARACTER_TRIVIAL_CONSTANTS) {
        return this->as_bool() ? "t" : "f";
      } else {
        return this->as_bool() ? "true" : "false";
      }

    case 2: { // int64_t
      int64_t v = this->as_int();
      if (options & SerializeOption::HEX_INTEGERS) {
        return v < 0 ? string_printf("-0x%" PRIX64, -v) : string_printf("0x%" PRIX64, v);
      } else {
        return to_string(this->as_int());
      }
    }

    case 3: { // double
      string ret = string_printf("%g", this->as_float());
      if (ret.find('.') == string::npos) {
        return ret + ".0";
      }
      return ret;
    }

    case 4: // string
      return "\"" + JSON::escape_string(this->as_string(), escape_mode) + "\"";

    case 5: { // list_type
      bool format = options & SerializeOption::FORMAT;

      const auto& list = this->as_list();
      if (list.empty()) {
        return "[]";
      }

      string ret = "[";
      for (const unique_ptr<JSON>& o : list) {
        if (ret.size() > 1) {
          ret += ',';
        }
        if (format) {
          ret += '\n' + string(indent_level + 2, ' ') + o->serialize(options, indent_level + 2);
        } else {
          ret += o->serialize(options);
        }
      }
      if (format) {
        return ret + '\n' + string(indent_level, ' ') + "]";
      } else {
        return ret + "]";
      }
    }

    case 6: { // dict_type
      bool format = options & SerializeOption::FORMAT;
      bool sort_keys = options & SerializeOption::SORT_DICT_KEYS;

      const auto& dict = this->as_dict();
      if (dict.empty()) {
        return "{}";
      }

      string ret = "{";
      auto add_key = [&](const string& key, const JSON& value) -> void {
        if (ret.size() > 1) {
          ret += ',';
        }
        string escaped_key = JSON::escape_string(key, escape_mode);
        if (format) {
          ret += '\n' + string(indent_level + 2, ' ') + "\"" + escaped_key + "\": " + value.serialize(options, indent_level + 2);
        } else {
          ret += "\"" + escaped_key + "\":" + value.serialize(options);
        }
      };

      if (sort_keys) {
        // Note: We're kind of breaking abstraction here (the values in sorted
        // point to objects owned by unique_ptrs) but the lifetimes of these
        // objects are assumed to span this entire function, so it's ok to do
        // this temporarily.
        map<string, JSON*> sorted;
        for (const auto& o : dict) {
          sorted.emplace(o.first, o.second.get());
        }
        for (const auto& o : sorted) {
          add_key(o.first, *o.second);
        }
      } else {
        for (const auto& o : dict) {
          add_key(o.first, *o.second);
        }
      }
      if (format) {
        return ret + '\n' + string(indent_level, ' ') + "}";
      } else {
        return ret + "}";
      }
    }

    default:
      throw parse_error("unknown object type");
  }
}